

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_block.cpp
# Opt level: O2

void multikey_block<1024u,unsigned_short>(uchar **strings,size_t n,size_t depth)

{
  long lVar1;
  ushort uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint __line;
  pointer ppppuVar7;
  unsigned_short uVar8;
  uint16_t uVar9;
  int iVar10;
  iterator __tmp;
  Block ppuVar11;
  _List_node_base *p_Var12;
  Block ppuVar13;
  ulong uVar14;
  uint j;
  Block __dest;
  uchar **ppuVar15;
  char *__assertion;
  size_t i;
  ulong uVar16;
  ulong uVar17;
  _List_node_base **pp_Var19;
  long lVar20;
  ulong uVar21;
  char local_ea;
  array<unsigned_long,_3UL> bucketsize;
  _Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_> local_a8;
  _List_node_base *local_90;
  long local_88;
  Block block;
  value_type *local_78;
  array<unsigned_short,_32UL> cache;
  unsigned_long uVar18;
  
  if (n < 10000) {
    mkqsort(strings,(int)n,(int)depth);
    return;
  }
  if ((multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
       buckets_abi_cxx11_ == '\0') &&
     (iVar10 = __cxa_guard_acquire(&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                                    ::buckets_abi_cxx11_), iVar10 != 0)) {
    std::array<std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>,_3UL>::array
              (&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
                buckets_abi_cxx11_);
    __cxa_atexit(std::
                 array<std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>,_3UL>
                 ::~array,&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                           ::buckets_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                         ::buckets_abi_cxx11_);
  }
  if ((multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
       freeblocks_abi_cxx11_ == '\0') &&
     (iVar10 = __cxa_guard_acquire(&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                                    ::freeblocks_abi_cxx11_), iVar10 != 0)) {
    multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
    freeblocks_abi_cxx11_.super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
    _M_impl._M_node.super__List_node_base._M_prev =
         (_List_node_base *)
         &multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
          freeblocks_abi_cxx11_;
    multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
    freeblocks_abi_cxx11_.super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
    _M_impl._M_node.super__List_node_base._M_next =
         (_List_node_base *)
         &multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
          freeblocks_abi_cxx11_;
    multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
    freeblocks_abi_cxx11_.super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
    _M_impl._M_node._M_size = 0;
    __cxa_atexit(std::__cxx11::_List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>::
                 ~_List_base,
                 &multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                  ::freeblocks_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                         ::freeblocks_abi_cxx11_);
  }
  uVar8 = pseudo_median<unsigned_short>(strings,n,depth);
  std::vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>::vector
            ((vector<unsigned_char_***,_std::allocator<unsigned_char_***>_> *)&local_a8,
             (n >> 10) + 1,(allocator_type *)&cache);
  cache._M_elems[0] = 0;
  cache._M_elems[1] = 0;
  cache._M_elems[2] = 0;
  cache._M_elems[3] = 0;
  std::array<unsigned_long,_3UL>::fill(&bucketsize,(value_type_conflict1 *)&cache);
  std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::clear
            (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
             buckets_abi_cxx11_._M_elems);
  std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::clear
            (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
             buckets_abi_cxx11_._M_elems + 1);
  std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::clear
            (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
             buckets_abi_cxx11_._M_elems + 2);
  if (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
      freeblocks_abi_cxx11_.super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
      _M_impl._M_node.super__List_node_base._M_next ==
      (_List_node_base *)
      &multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
       freeblocks_abi_cxx11_) {
    for (lVar20 = 0; lVar20 != 0x40000; lVar20 = lVar20 + 0x2000) {
      cache._M_elems._0_8_ =
           (long)multikey_block<1024U,_unsigned_short>::temp_space._M_elems + lVar20;
      std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::push_back
                (&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                  ::freeblocks_abi_cxx11_,(value_type *)&cache);
    }
    ppuVar15 = strings;
    for (uVar16 = 0; uVar16 < (n & 0xfffffffffffffc00); uVar16 = uVar16 + 0x400) {
      cache._M_elems._0_8_ = ppuVar15;
      std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::push_back
                (&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                  ::freeblocks_abi_cxx11_,(value_type *)&cache);
      ppuVar15 = ppuVar15 + 0x400;
    }
    local_90 = (_List_node_base *)(n & 0xffffffffffffffe0);
    ppuVar11 = strings + n;
    p_Var12 = (_List_node_base *)0x0;
    ppuVar15 = strings;
    do {
      if (local_90 <= p_Var12) {
        for (; p_Var12 < n; p_Var12 = (_List_node_base *)((long)&p_Var12->_M_next + 1)) {
          uVar9 = get_char<unsigned_short>(strings[(long)p_Var12],depth);
          lVar20 = (ulong)(uVar9 == uVar8) + (ulong)(uVar8 <= uVar9 && uVar9 != uVar8) * 2;
          if ((bucketsize._M_elems[lVar20] & 0x3ff) == 0) {
            cache._M_elems._0_8_ =
                 take_free_block(&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                                  ::freeblocks_abi_cxx11_);
            std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::push_back
                      (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                       ::buckets_abi_cxx11_._M_elems + lVar20,(value_type *)&cache);
            if ((ulong)cache._M_elems._0_8_ < ppuVar11 && strings <= (ulong)cache._M_elems._0_8_) {
              auVar4._8_8_ = cache._M_elems._0_8_ - (long)strings >> 0x3f;
              auVar4._0_8_ = cache._M_elems._0_8_ - (long)strings >> 3;
              local_a8._M_impl.super__Vector_impl_data._M_start[SUB168(auVar4 / SEXT816(0x400),0)] =
                   (uchar ***)
                   (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                    ::buckets_abi_cxx11_._M_elems[lVar20].
                    super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                    _M_node.super__List_node_base._M_prev + 1);
            }
          }
          if (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
              buckets_abi_cxx11_._M_elems[lVar20].
              super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
              super__List_node_base._M_next ==
              (_List_node_base *)
              (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
               buckets_abi_cxx11_._M_elems + lVar20)) {
            __assert_fail("not buckets[b].empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_block.cpp"
                          ,0x80,
                          "void multikey_block(unsigned char **, size_t, size_t) [B = 1024U, CharT = unsigned short]"
                         );
          }
          uVar18 = bucketsize._M_elems[lVar20];
          (&(multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
             buckets_abi_cxx11_._M_elems[lVar20].
             super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
             super__List_node_base._M_prev[1]._M_next)->_M_next)[(uint)uVar18 & 0x3ff] =
               (_List_node_base *)strings[(long)p_Var12];
          bucketsize._M_elems[lVar20] = uVar18 + 1;
        }
        if (bucketsize._M_elems[1] + bucketsize._M_elems[0] + bucketsize._M_elems[2] != n) {
          __assert_fail("bucketsize[0]+bucketsize[1]+bucketsize[2]==n",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_block.cpp"
                        ,0x84,
                        "void multikey_block(unsigned char **, size_t, size_t) [B = 1024U, CharT = unsigned short]"
                       );
        }
        lVar20 = 0;
        uVar16 = 0;
        do {
          if (lVar20 == 3) {
            std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::clear
                      (&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                        ::freeblocks_abi_cxx11_);
            cache._M_elems._0_8_ = local_a8._M_impl.super__Vector_impl_data._M_start;
            cache._M_elems._16_8_ = local_a8._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::_Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>::~_Vector_base
                      ((_Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_> *)&cache
                      );
            multikey_block<1024u,unsigned_short>(strings,bucketsize._M_elems[0],depth);
            local_ea = (char)uVar8;
            if (local_ea != '\0') {
              multikey_block<1024u,unsigned_short>
                        (strings + bucketsize._M_elems[0],bucketsize._M_elems[1],depth + 2);
            }
            multikey_block<1024u,unsigned_short>
                      (strings + bucketsize._M_elems[0] + bucketsize._M_elems[1],
                       bucketsize._M_elems[2],depth);
            std::_Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>::~_Vector_base
                      (&local_a8);
            return;
          }
          uVar18 = bucketsize._M_elems[lVar20];
          if (uVar18 != 0) {
            p_Var12 = (_List_node_base *)
                      (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                       ::buckets_abi_cxx11_._M_elems + lVar20);
            local_88 = lVar20;
            for (uVar14 = 0; uVar17 = uVar18 - uVar14, uVar14 <= uVar18 && uVar17 != 0;
                uVar14 = uVar14 + 0x400) {
              if (0x3ff < uVar17) {
                uVar17 = 0x400;
              }
              p_Var12 = (((_List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_> *)
                         &p_Var12->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
              ppuVar13 = *(Block *)(p_Var12 + 1);
              __dest = strings + uVar16;
              if (ppuVar13 == __dest) {
                if ((uVar16 & 0x3ff) != 0) {
                  __assert_fail("pos%B==0",
                                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_block.cpp"
                                ,0x92,
                                "void multikey_block(unsigned char **, size_t, size_t) [B = 1024U, CharT = unsigned short]"
                               );
                }
                *(undefined8 *)
                 ((long)local_a8._M_impl.super__Vector_impl_data._M_start + (uVar16 >> 7)) = 0;
              }
              else {
                uVar21 = (uVar16 + uVar17) - 1 >> 10;
                pp_Var19 = &p_Var12[1]._M_next;
                local_90 = p_Var12;
                if (local_a8._M_impl.super__Vector_impl_data._M_start[uVar21] != (uchar ***)0x0) {
                  do {
                    local_78 = (value_type *)pp_Var19;
                    ppuVar13 = take_free_block(&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                                                ::freeblocks_abi_cxx11_);
                    ppppuVar7 = local_a8._M_impl.super__Vector_impl_data._M_start;
                    if (ppuVar13 < strings) break;
                    pp_Var19 = (_List_node_base **)local_78;
                  } while (ppuVar13 < __dest);
                  if (ppuVar13 < ppuVar11 && strings <= ppuVar13) {
                    auVar5._8_8_ = (long)ppuVar13 - (long)strings >> 0x3f;
                    auVar5._0_8_ = (long)ppuVar13 - (long)strings >> 3;
                    lVar20 = SUB168(auVar5 / SEXT816(0x400),0);
                    if (local_a8._M_impl.super__Vector_impl_data._M_start[lVar20] != (uchar ***)0x0)
                    {
                      __assert_fail("backlinks[(tmp-strings)/B]==0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_block.cpp"
                                    ,0xa2,
                                    "void multikey_block(unsigned char **, size_t, size_t) [B = 1024U, CharT = unsigned short]"
                                   );
                    }
                    local_a8._M_impl.super__Vector_impl_data._M_start[lVar20] =
                         local_a8._M_impl.super__Vector_impl_data._M_start[uVar21];
                  }
                  memcpy(ppuVar13,*local_a8._M_impl.super__Vector_impl_data._M_start[uVar21],0x2000)
                  ;
                  *ppppuVar7[uVar21] = ppuVar13;
                  local_a8._M_impl.super__Vector_impl_data._M_start[uVar21] = (uchar ***)0x0;
                  ppuVar13 = *local_78;
                  pp_Var19 = (_List_node_base **)local_78;
                }
                lVar20 = local_88;
                if (ppuVar13 < ppuVar11 && strings <= ppuVar13) {
                  if (ppuVar13 <= __dest) {
                    __assert_fail("*it > strings+pos",
                                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_block.cpp"
                                  ,0xaa,
                                  "void multikey_block(unsigned char **, size_t, size_t) [B = 1024U, CharT = unsigned short]"
                                 );
                  }
                  auVar6._8_8_ = (long)ppuVar13 - (long)strings >> 0x3f;
                  auVar6._0_8_ = (long)ppuVar13 - (long)strings >> 3;
                  local_a8._M_impl.super__Vector_impl_data._M_start
                  [SUB168(auVar6 / SEXT816(0x400),0)] = (uchar ***)0x0;
                  ppuVar13 = (Block)*pp_Var19;
                }
                memcpy(__dest,ppuVar13,uVar17 * 8);
                if (*pp_Var19 < ppuVar11 && strings <= *pp_Var19) {
                  std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::push_back
                            (&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                              ::freeblocks_abi_cxx11_,(value_type *)pp_Var19);
                  p_Var12 = local_90;
                }
                else {
                  std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::
                  push_front(&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                              ::freeblocks_abi_cxx11_,(value_type *)pp_Var19);
                  p_Var12 = local_90;
                }
              }
              uVar16 = uVar16 + uVar17;
              uVar18 = bucketsize._M_elems[lVar20];
            }
          }
          lVar20 = lVar20 + 1;
        } while( true );
      }
      for (lVar20 = 0; lVar20 != 0x20; lVar20 = lVar20 + 1) {
        uVar9 = get_char<unsigned_short>(ppuVar15[lVar20],depth);
        cache._M_elems[lVar20] = uVar9;
      }
      for (lVar20 = 0; lVar20 != 0x20; lVar20 = lVar20 + 1) {
        uVar2 = cache._M_elems[lVar20];
        lVar1 = (ulong)(uVar2 == uVar8) + (ulong)(uVar8 <= uVar2 && uVar2 != uVar8) * 2;
        if ((bucketsize._M_elems[lVar1] & 0x3ff) == 0) {
          block = take_free_block(&multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                                   ::freeblocks_abi_cxx11_);
          std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::push_back
                    (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                     ::buckets_abi_cxx11_._M_elems + lVar1,&block);
          if (block < ppuVar11 && strings <= block) {
            auVar3._8_8_ = (long)block - (long)strings >> 0x3f;
            auVar3._0_8_ = (long)block - (long)strings >> 3;
            local_a8._M_impl.super__Vector_impl_data._M_start[SUB168(auVar3 / SEXT816(0x400),0)] =
                 (uchar ***)
                 (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                  ::buckets_abi_cxx11_._M_elems[lVar1].
                  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                  _M_node.super__List_node_base._M_prev + 1);
          }
        }
        if (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
            buckets_abi_cxx11_._M_elems[lVar1].
            super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
            super__List_node_base._M_next ==
            (_List_node_base *)
            (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
             buckets_abi_cxx11_._M_elems + lVar1)) {
          __assertion = "not buckets[b].empty()";
          __line = 0x6e;
          goto LAB_001b44e4;
        }
        uVar18 = bucketsize._M_elems[lVar1];
        (&(multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
           buckets_abi_cxx11_._M_elems[lVar1].
           super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
           super__List_node_base._M_prev[1]._M_next)->_M_next)[(uint)uVar18 & 0x3ff] =
             (_List_node_base *)ppuVar15[lVar20];
        bucketsize._M_elems[lVar1] = uVar18 + 1;
      }
      p_Var12 = p_Var12 + 2;
      ppuVar15 = ppuVar15 + 0x20;
    } while( true );
  }
  __assertion = "freeblocks.empty()";
  __line = 0x54;
LAB_001b44e4:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_block.cpp"
                ,__line,
                "void multikey_block(unsigned char **, size_t, size_t) [B = 1024U, CharT = unsigned short]"
               );
}

Assistant:

static void
multikey_block(unsigned char** strings, size_t n, size_t depth)
{
	if (n < 10000) {
		mkqsort(strings, n, depth);
		return;
	}
	assert(n > B);
	static Buckets buckets;
	static std::array<unsigned char*, 32*B> temp_space;
	static FreeBlocks freeblocks;
	const CharT partval = pseudo_median<CharT>(strings, n, depth);
	BackLinks backlinks(n/B+1);
	std::array<size_t, 3> bucketsize;
	bucketsize.fill(0);
	buckets[0].clear();
	buckets[1].clear();
	buckets[2].clear();
	// Initialize our list of free blocks.
	assert(freeblocks.empty());
	for (size_t i=0; i < 32; ++i)
		freeblocks.push_back(&temp_space[i*B]);
	for (size_t i=0; i < n-n%B; i+=B)
		freeblocks.push_back(strings+i);
	// Distribute strings to buckets. Use a small cache to reduce memory
	// stalls. The exact size of the cache is not very important.
	size_t i=0;
	for (; i < n-n%32; i+=32) {
		std::array<CharT, 32> cache;
		for (unsigned j=0; j<32; ++j) {
			cache[j] = get_char<CharT>(strings[i+j], depth);
		}
		for (unsigned j=0; j<32; ++j) {
			const CharT c = cache[j];
			const unsigned b = get_bucket(c, partval);
			if (bucketsize[b] % B == 0) {
				Block block = take_free_block(freeblocks);
				buckets[b].push_back(block);
				// Backlinks must be set for those blocks, that
				// use the original string array space.
				if (block >= strings && block < strings+n) {
					backlinks[(block-strings)/B] =
						&(buckets[b].back());
				}
			}
			assert(not buckets[b].empty());
			buckets[b].back()[bucketsize[b] % B] = strings[i+j];
			++bucketsize[b];
		}
	}
	for (; i < n; ++i) {
		const CharT c = get_char<CharT>(strings[i], depth);
		const unsigned b = get_bucket(c, partval);
		if (bucketsize[b] % B == 0) {
			Block block = take_free_block(freeblocks);
			buckets[b].push_back(block);
			// Backlinks must be set for those blocks, that
			// use the original string array space.
			if (block >= strings && block < strings+n) {
				backlinks[(block-strings)/B] =
					&(buckets[b].back());
			}
		}
		assert(not buckets[b].empty());
		buckets[b].back()[bucketsize[b] % B] = strings[i];
		++bucketsize[b];
	}
	assert(bucketsize[0]+bucketsize[1]+bucketsize[2]==n);
	// Process each bucket, and copy all strings in that bucket to proper
	// place in the original string pointer array. This means that those
	// positions that are occupied by other blocks must be moved to free
	// space etc.
	size_t pos = 0;
	for (unsigned i=0; i < 3; ++i) {
		if (bucketsize[i] == 0) continue;
		Bucket::const_iterator it = buckets[i].begin();
		for (size_t bucket_pos=0; bucket_pos < bucketsize[i]; ++it, bucket_pos+=B) {
			const size_t block_items = std::min(size_t(B), bucketsize[i]-bucket_pos);
			const size_t block_overlap = (pos+block_items-1)/B;
			if (*it == (strings+pos)) {
				// Already at correct place.
				assert(pos%B==0);
				backlinks[pos/B] = 0;
				pos += block_items;
				continue;
			}
			// Don't overwrite the block in the position we are
			// about to write to, but copy it into safety.
			if (backlinks[block_overlap]) {
				// Take a free block. The block can be 'stale',
				// i.e. it can point to positions we have
				// already copied new strings into. Take free
				// blocks until we have non-stale block.
				Block tmp = take_free_block(freeblocks);
				while (tmp >= strings && tmp < strings+pos)
					tmp = take_free_block(freeblocks);
				if (tmp >= strings && tmp < strings+n) {
					assert(backlinks[(tmp-strings)/B]==0);
					backlinks[(tmp-strings)/B] = backlinks[block_overlap];
				}
				memcpy(tmp, *(backlinks[block_overlap]), B*sizeof(unsigned char*));
				*(backlinks[block_overlap]) = tmp;
				backlinks[block_overlap] = 0;
			}
			if (*it >= strings && *it < strings+n) {
				assert(*it > strings+pos);
				backlinks[(*it-strings)/B] = 0;
			}
			// Copy string pointers to correct position.
			memcpy(strings+pos, *it, block_items*sizeof(unsigned char*));
			// Return block for later use. Favor those in the
			// temporary space.
			if (*it >= strings && *it < strings+n) {
				freeblocks.push_back(*it);
			} else {
				freeblocks.push_front(*it);
			}
			pos += block_items;
		}
	}
	freeblocks.clear();
	backlinks.clear(); BackLinks().swap(backlinks);
	multikey_block<B, CharT>(strings, bucketsize[0], depth);
	if (not is_end(partval))
		multikey_block<B, CharT>(strings+bucketsize[0], bucketsize[1],
				depth+sizeof(CharT));
	multikey_block<B, CharT>(strings+bucketsize[0]+bucketsize[1],
			bucketsize[2], depth);
}